

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

TreeNodePtr __thiscall
OpenMD::NameFinder::createNode(NameFinder *this,TreeNodePtr *parent,string *name)

{
  SimInfo *pSVar1;
  pointer pcVar2;
  iterator iVar3;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  TreeNodePtr TVar5;
  _Vector_base<int,_std::allocator<int>_> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
  local_58;
  
  this->info_ = (SimInfo *)0x0;
  (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>_>
                  *)((name->_M_dataplus)._M_p + 0x38),in_RCX);
  if (iVar3._M_node == (_Base_ptr)((name->_M_dataplus)._M_p + 0x40)) {
    std::make_shared<OpenMD::TreeNode>();
    std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.first._M_string_length);
    std::__cxx11::string::_M_assign((string *)this->info_);
    pSVar1 = this->info_;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_70,
               (vector<int,_std::allocator<int>_> *)
               &(parent->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    SelectionSet::resize
              ((SelectionSet *)
               &(pSVar1->randNumGen_).
                super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(vector<int,_std::allocator<int>_> *)&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
    pcVar2 = (name->_M_dataplus)._M_p;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
    ::pair<std::shared_ptr<OpenMD::TreeNode>_&,_true>
              (&local_58,in_RCX,(shared_ptr<OpenMD::TreeNode> *)this);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<OpenMD::TreeNode>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>>
                *)(pcVar2 + 0x38),&local_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
    ::~pair(&local_58);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(iVar3._M_node + 2));
    _Var4._M_pi = extraout_RDX;
  }
  TVar5.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  TVar5.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TreeNodePtr)TVar5.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TreeNodePtr NameFinder::createNode(TreeNodePtr parent,
                                     const std::string& name) {
    TreeNodePtr node;
    std::map<std::string, TreeNodePtr>::iterator foundIter;
    foundIter = parent->children.find(name);
    if (foundIter == parent->children.end()) {
      node       = std::make_shared<TreeNode>();
      node->name = name;
      node->bs.resize(nObjects_);
      parent->children.insert(std::make_pair(name, node));
    } else {
      node = foundIter->second;
    }
    return node;
  }